

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O3

void irr::video::CColorConverter::convert_A1R5G5B5toB8G8R8(void *sP,s32 sN,void *dP)

{
  long lVar1;
  u16 *sB;
  
  if (0 < sN) {
    lVar1 = 0;
    do {
      *(byte *)dP = (byte)(*(ushort *)((long)sP + lVar1 * 2) >> 7) & 0xf8;
      *(byte *)((long)dP + 1) = (byte)(*(ushort *)((long)sP + lVar1 * 2) >> 2) & 0xf8;
      *(char *)((long)dP + 2) = *(char *)((long)sP + lVar1 * 2) << 3;
      dP = (void *)((long)dP + 3);
      lVar1 = lVar1 + 1;
    } while (sN != (int)lVar1);
  }
  return;
}

Assistant:

void CColorConverter::convert_A1R5G5B5toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u16 *sB = (u16 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		dB[0] = (*sB & 0x7c00) >> 7;
		dB[1] = (*sB & 0x03e0) >> 2;
		dB[2] = (*sB & 0x1f) << 3;

		sB += 1;
		dB += 3;
	}
}